

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_address.cpp
# Opt level: O0

Script * __thiscall
cfd::core::Address::GetLockingScript(Script *__return_storage_ptr__,Address *this)

{
  Script local_220;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1e8;
  undefined1 local_1d0 [8];
  ByteData256 script_hash_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_180;
  undefined1 local_168 [8];
  ByteData160 pubkey_hash_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_118;
  undefined1 local_100 [8];
  ByteData160 script_hash;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_b0;
  undefined1 local_98 [8];
  ByteData160 pubkey_hash;
  ByteData256 local_70;
  Script local_58;
  undefined1 local_19;
  Address *local_18;
  Address *this_local;
  Script *locking_script;
  
  local_19 = 0;
  local_18 = this;
  this_local = (Address *)__return_storage_ptr__;
  Script::Script(__return_storage_ptr__);
  switch(this->addr_type_) {
  case kP2shAddress:
  case kP2shP2wshAddress:
  case kP2shP2wpkhAddress:
    ByteData::GetBytes(&local_118,&this->hash_);
    ByteData160::ByteData160((ByteData160 *)local_100,&local_118);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_118);
    ScriptUtil::CreateP2shLockingScript
              ((Script *)
               &pubkey_hash_1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteData160 *)local_100);
    Script::operator=(__return_storage_ptr__,
                      (Script *)
                      &pubkey_hash_1.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Script::~Script((Script *)
                    &pubkey_hash_1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    ByteData160::~ByteData160((ByteData160 *)local_100);
    break;
  case kP2pkhAddress:
    ByteData::GetBytes(&local_b0,&this->hash_);
    ByteData160::ByteData160((ByteData160 *)local_98,&local_b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b0);
    ScriptUtil::CreateP2pkhLockingScript
              ((Script *)
               &script_hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData160 *)local_98);
    Script::operator=(__return_storage_ptr__,
                      (Script *)
                      &script_hash.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Script::~Script((Script *)
                    &script_hash.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    ByteData160::~ByteData160((ByteData160 *)local_98);
    break;
  case kP2wshAddress:
    ByteData::GetBytes(&local_1e8,&this->hash_);
    ByteData256::ByteData256((ByteData256 *)local_1d0,&local_1e8);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1e8);
    ScriptUtil::CreateP2wshLockingScript(&local_220,(ByteData256 *)local_1d0);
    Script::operator=(__return_storage_ptr__,&local_220);
    Script::~Script(&local_220);
    ByteData256::~ByteData256((ByteData256 *)local_1d0);
    break;
  case kP2wpkhAddress:
    ByteData::GetBytes(&local_180,&this->hash_);
    ByteData160::ByteData160((ByteData160 *)local_168,&local_180);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
    ScriptUtil::CreateP2wpkhLockingScript
              ((Script *)
               &script_hash_1.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(ByteData160 *)local_168);
    Script::operator=(__return_storage_ptr__,
                      (Script *)
                      &script_hash_1.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Script::~Script((Script *)
                    &script_hash_1.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
    ByteData160::~ByteData160((ByteData160 *)local_168);
    break;
  case kTaprootAddress:
    ByteData256::ByteData256(&local_70,&this->hash_);
    ScriptUtil::CreateTaprootLockingScript(&local_58,&local_70);
    Script::operator=(__return_storage_ptr__,&local_58);
    Script::~Script(&local_58);
    ByteData256::~ByteData256(&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

Script Address::GetLockingScript() const {
  Script locking_script;
  switch (addr_type_) {
    case AddressType::kTaprootAddress:
      locking_script =
          ScriptUtil::CreateTaprootLockingScript(ByteData256(hash_));
      break;
    case AddressType::kP2pkhAddress: {
      ByteData160 pubkey_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2pkhLockingScript(pubkey_hash);
      break;
    }
    case AddressType::kP2shP2wpkhAddress:
      // fall-through
    case AddressType::kP2shP2wshAddress:
      // fall-through
    case AddressType::kP2shAddress: {
      ByteData160 script_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2shLockingScript(script_hash);
      break;
    }
    case AddressType::kP2wpkhAddress: {
      ByteData160 pubkey_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2wpkhLockingScript(pubkey_hash);
      break;
    }
    case AddressType::kP2wshAddress: {
      ByteData256 script_hash(hash_.GetBytes());
      locking_script = ScriptUtil::CreateP2wshLockingScript(script_hash);
      break;
    }
    default:
      break;
  }
  return locking_script;
}